

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.cpp
# Opt level: O2

byte_vec_t * __thiscall
sfc::Map::native_data
          (byte_vec_t *__return_storage_ptr__,Map *this,bool column_order,uint split_w,uint split_h)

{
  Mapentry *pMVar1;
  Mapentry *entry;
  pointer pvVar2;
  byte_vec_t nd;
  vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>
  local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  collect_entries(&local_60,this,column_order,split_w,split_h);
  for (pvVar2 = local_60.
                super__Vector_base<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pvVar2 != local_60.
                super__Vector_base<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pvVar2 = pvVar2 + 1) {
    pMVar1 = (pvVar2->super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (entry = (pvVar2->super__Vector_base<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>)._M_impl
                 .super__Vector_impl_data._M_start; entry != pMVar1; entry = entry + 1) {
      pack_native_mapentry((byte_vec_t *)&local_48,entry,this->_mode);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (const_iterator)
                 (__return_storage_ptr__->
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_48._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )local_48._M_impl.super__Vector_impl_data._M_finish);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    }
  }
  std::
  vector<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>,_std::allocator<std::vector<sfc::Mapentry,_std::allocator<sfc::Mapentry>_>_>_>
  ::~vector(&local_60);
  return __return_storage_ptr__;
}

Assistant:

byte_vec_t Map::native_data(bool column_order, unsigned split_w, unsigned split_h) const {
  byte_vec_t data;
  for (const auto& vm : collect_entries(column_order, split_w, split_h)) {
    for (const auto& m : vm) {
      auto nd = sfc::pack_native_mapentry(m, _mode);
      data.insert(data.end(), nd.begin(), nd.end());
    }
  }
  return data;
}